

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O1

void __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_string(tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  tag_t<cfgfile::string_trait_t> **pptVar1;
  pointer pcVar2;
  constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar3;
  int iVar4;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  _Var5;
  exception_t<cfgfile::string_trait_t> *peVar6;
  pos_t pos;
  pos_t pos_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  value_type local_1d0;
  string_t local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pptVar1 = (this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::string_trait_t>::is_any_child_defined()const::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>*)_1_>>
                    ((this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,pptVar1);
  if (_Var5._M_current != pptVar1) {
    peVar6 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Value \"","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::operator+(&local_150,&local_170,str);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"\" for tag \"","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_230._M_dataplus._M_p,
               local_230._M_dataplus._M_p + local_230._M_string_length);
    std::operator+(&local_130,&local_150,&local_210);
    std::operator+(&local_110,&local_130,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"\" must be defined before any child tag. In file \"","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,local_270._M_dataplus._M_p,
               local_270._M_dataplus._M_p + local_270._M_string_length);
    std::operator+(&local_f0,&local_110,&local_250);
    std::operator+(&local_d0,&local_f0,&info->m_file_name);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"\" on line ","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::operator+(&local_b0,&local_d0,&local_290);
    string_trait_t::to_string_abi_cxx11_(&local_1b0,(string_trait_t *)info->m_line_number,pos);
    std::operator+(&local_1d0,&local_b0,&local_1b0);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,".","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_2d0._M_dataplus._M_p,
               local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
    std::operator+(&local_50,&local_1d0,&local_190);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar6,&local_50);
    __cxa_throw(peVar6,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  pcVar2 = (str->_M_dataplus)._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,pcVar2 + str->_M_string_length);
  pcVar3 = this->m_constraint;
  if (pcVar3 != (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    iVar4 = (*pcVar3->_vptr_constraint_t[2])(pcVar3,&local_1d0);
    if ((char)iVar4 == '\0') {
      peVar6 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Invalid value: \"","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_210._M_dataplus._M_p,
                 local_210._M_dataplus._M_p + local_210._M_string_length);
      std::operator+(&local_170,&local_1f0,str);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,"\". Value must match to the constraint in tag \"","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_250._M_dataplus._M_p,
                 local_250._M_dataplus._M_p + local_250._M_string_length);
      std::operator+(&local_150,&local_170,&local_230);
      std::operator+(&local_130,&local_150,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\". In file \"","");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_290._M_dataplus._M_p,
                 local_290._M_dataplus._M_p + local_290._M_string_length);
      std::operator+(&local_110,&local_130,&local_270);
      std::operator+(&local_f0,&local_110,&info->m_file_name);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\" on line ","");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,local_1b0._M_dataplus._M_p,
                 local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
      std::operator+(&local_d0,&local_f0,&local_2b0);
      string_trait_t::to_string_abi_cxx11_(&local_190,(string_trait_t *)info->m_line_number,pos_00);
      std::operator+(&local_b0,&local_d0,&local_190);
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".","");
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_90,local_90 + local_88);
      std::operator+(&local_70,&local_b0,&local_2d0);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar6,&local_70);
      __cxa_throw(peVar6,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_values,&local_1d0);
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any child "
					"tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const T value = format_t< T, Trait >::from_string( info, str );

		if( m_constraint )
		{
			if( !m_constraint->check( value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					str + Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		m_values.push_back( value );

		this->set_defined();
	}